

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

void __thiscall VertexAttrib64Bit::VAOTest::deinit(VAOTest *this)

{
  if (this->m_bo_1_data != (uchar *)0x0) {
    operator_delete__(this->m_bo_1_data);
    this->m_bo_1_data = (uchar *)0x0;
  }
  if (this->m_bo_2_data != (uchar *)0x0) {
    operator_delete__(this->m_bo_2_data);
    this->m_bo_2_data = (uchar *)0x0;
  }
  if (this->m_bo_index_data != (unsigned_short *)0x0) {
    operator_delete__(this->m_bo_index_data);
    this->m_bo_index_data = (unsigned_short *)0x0;
  }
  if (this->m_bo_id_1 != 0) {
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_bo_id_1);
    this->m_bo_id_1 = 0;
  }
  if (this->m_bo_id_2 != 0) {
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_bo_id_2);
    this->m_bo_id_2 = 0;
  }
  if (this->m_bo_id_indices != 0) {
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_bo_id_indices);
    this->m_bo_id_indices = 0;
  }
  if (this->m_bo_id_result != 0) {
    (*(this->super_Base).gl.deleteBuffers)(1,&this->m_bo_id_result);
    this->m_bo_id_result = 0;
  }
  if (this->m_po_id != 0) {
    (*(this->super_Base).gl.deleteProgram)(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_vao_id != 0) {
    (*(this->super_Base).gl.deleteVertexArrays)(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_vs_id != 0) {
    (*(this->super_Base).gl.deleteShader)(this->m_vs_id);
    this->m_vs_id = 0;
  }
  return;
}

Assistant:

void VAOTest::deinit()
{
	if (m_bo_1_data != DE_NULL)
	{
		delete[] m_bo_1_data;

		m_bo_1_data = DE_NULL;
	}

	if (m_bo_2_data != DE_NULL)
	{
		delete[] m_bo_2_data;

		m_bo_2_data = DE_NULL;
	}

	if (m_bo_index_data != DE_NULL)
	{
		delete[] m_bo_index_data;

		m_bo_index_data = DE_NULL;
	}

	if (m_bo_id_1 != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_1);

		m_bo_id_1 = 0;
	}

	if (m_bo_id_2 != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_2);

		m_bo_id_2 = 0;
	}

	if (m_bo_id_indices != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_indices);

		m_bo_id_indices = 0;
	}

	if (m_bo_id_result != 0)
	{
		gl.deleteBuffers(1, &m_bo_id_result);

		m_bo_id_result = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}
}